

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

void __thiscall
SSTable::toSSTable(SSTable *this,SkipList *memTable,string *fileName,uint64_t timeStamp)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t *puVar6;
  string *psVar7;
  runtime_error *this_00;
  long *plVar8;
  _WordT *p_Var9;
  void *__buf;
  int iVar10;
  ConstIterator i;
  ofstream out;
  BloomFilter bloomFilter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a58;
  ConstIterator local_2a38;
  long local_2a30;
  filebuf local_2a28 [24];
  byte abStack_2a10 [216];
  ios_base local_2938 [264];
  BloomFilter local_2830;
  
  std::ofstream::ofstream(&local_2a30,(string *)memTable,_S_trunc|_S_out|_S_bin);
  if ((abStack_2a10[*(long *)(local_2a30 + -0x18)] & 5) == 0) {
    uVar3 = SkipList::getLength((SkipList *)this);
    uVar4 = SkipList::getMinKey((SkipList *)this);
    uVar5 = SkipList::getMaxKey((SkipList *)this);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = (_WordT)fileName;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = uVar3;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = uVar4;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = uVar5;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    BloomFilter::BloomFilter(&local_2830,(SkipList *)this);
    BloomFilter::write(&local_2830,(int)&local_2a30,__buf,timeStamp);
    local_2a38 = SkipList::constBegin((SkipList *)this);
    iVar10 = 0;
    while( true ) {
      bVar2 = SkipList::ConstIterator::hasNext(&local_2a38);
      if (!bVar2) break;
      SkipList::ConstIterator::next(&local_2a38);
      puVar6 = SkipList::ConstIterator::key(&local_2a38);
      local_2a58._M_dataplus._M_p = (pointer)*puVar6;
      std::ostream::write((char *)&local_2a30,(long)&local_2a58);
      local_2a58._M_dataplus._M_p._0_4_ = iVar10;
      std::ostream::write((char *)&local_2a30,(long)&local_2a58);
      psVar7 = SkipList::ConstIterator::value_abi_cxx11_(&local_2a38);
      iVar10 = iVar10 + (int)psVar7->_M_string_length;
    }
    local_2a58._M_dataplus._M_p = (pointer)0x0;
    std::ostream::write((char *)&local_2a30,(long)&local_2a58);
    local_2a58._M_dataplus._M_p._0_4_ = iVar10;
    std::ostream::write((char *)&local_2a30,(long)&local_2a58);
    local_2a38 = SkipList::constBegin((SkipList *)this);
    while( true ) {
      bVar2 = SkipList::ConstIterator::hasNext(&local_2a38);
      if (!bVar2) break;
      SkipList::ConstIterator::next(&local_2a38);
      psVar7 = SkipList::ConstIterator::value_abi_cxx11_(&local_2a38);
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      SkipList::ConstIterator::value_abi_cxx11_(&local_2a38);
      std::ostream::write((char *)&local_2a30,(long)pcVar1);
    }
    std::ofstream::close();
    local_2a30 = _VTT;
    *(undefined8 *)(local_2a28 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_2a28);
    std::ios_base::~ios_base(local_2938);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2a58,"toSSTable(SkipList): open file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)memTable);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a58);
  local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = *plVar8;
  p_Var9 = (_WordT *)(plVar8 + 2);
  if ((_WordT *)local_2830.bits.super__Base_bitset<1280UL>._M_w[0] == p_Var9) {
    local_2830.bits.super__Base_bitset<1280UL>._M_w[2] = *p_Var9;
    local_2830.bits.super__Base_bitset<1280UL>._M_w[3] = plVar8[3];
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] =
         (_WordT)(local_2830.bits.super__Base_bitset<1280UL>._M_w + 2);
  }
  else {
    local_2830.bits.super__Base_bitset<1280UL>._M_w[2] = *p_Var9;
  }
  local_2830.bits.super__Base_bitset<1280UL>._M_w[1] = plVar8[1];
  *plVar8 = (long)p_Var9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_2830);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::toSSTable(const SkipList &memTable, const string &fileName,
                        uint64_t timeStamp) {
  ofstream out(fileName, ios::out | ios::binary | ios::trunc);
  if (out.fail())
    throw runtime_error("toSSTable(SkipList): open file " + fileName +
                        " failed!");

  auto length = memTable.getLength();
  auto min = memTable.getMinKey();
  auto max = memTable.getMaxKey();

  // Header
  write64(out, timeStamp);
  write64(out, length);
  write64(out, min);
  write64(out, max);

  // Bloom Filter
  BloomFilter bloomFilter(memTable);
  bloomFilter.write(out);

  // Key, Offset
  auto i = memTable.constBegin();
  uint32_t offset = 0;
  while (i.hasNext()) {
    i.next();
    write64(out, i.key());
    write32(out, offset);
    offset += i.value().size();
  }
  write64(out, 0);
  write32(out, offset);

  // Value
  i = memTable.constBegin();
  while (i.hasNext()) {
    i.next();
    out.write(i.value().c_str(), i.value().size());
  }

  out.close();
}